

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void __thiscall hwnet::TCPSocket::Do(TCPSocket *this)

{
  Poller *this_00;
  bool bVar1;
  reference __x;
  enable_shared_from_this<hwnet::TCPSocket> local_68;
  shared_ptr<hwnet::Task> local_58;
  byte local_46;
  byte local_45;
  bool canWrite_;
  bool canRead_;
  undefined1 local_38 [8];
  value_type front;
  int i;
  bool doClose;
  TCPSocket *this_local;
  
  front._M_invoker._7_1_ = 0;
  front._M_invoker._0_4_ = 0;
  while( true ) {
    std::mutex::lock(&this->mtx);
    bVar1 = std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
            empty(&this->closures);
    if (!bVar1) {
      __x = std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
            front(&this->closures);
      std::function<void_()>::function((function<void_()> *)local_38,__x);
      std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
      pop_front(&this->closures);
      std::function<void_()>::operator()((function<void_()> *)local_38);
      std::function<void_()>::~function((function<void_()> *)local_38);
    }
    local_45 = canRead(this);
    local_46 = canWrite(this);
    if ((((local_45 & 1) == 0) && (!(bool)local_46)) ||
       (bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->closed), bVar1)) break;
    std::mutex::unlock(&this->mtx);
    if (9 < (int)front._M_invoker) {
      this_00 = this->poller_;
      std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this(&local_68);
      std::shared_ptr<hwnet::Task>::shared_ptr<hwnet::TCPSocket,void>
                (&local_58,(shared_ptr<hwnet::TCPSocket> *)&local_68);
      Poller::PostTask(this_00,&local_58,this->pool_);
      std::shared_ptr<hwnet::Task>::~shared_ptr(&local_58);
      std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)&local_68);
      return;
    }
    if ((local_45 & 1) != 0) {
      recvInWorker(this);
    }
    if ((local_46 & 1) != 0) {
      sendInWorker(this);
    }
    front._M_invoker._0_4_ = (int)front._M_invoker + 1;
  }
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->closed);
  if (bVar1) {
    front._M_invoker._7_1_ = 1;
  }
  else {
    this->doing = false;
  }
  std::mutex::unlock(&this->mtx);
  if ((front._M_invoker._7_1_ & 1) == 0) {
    return;
  }
  TCPSocket::doClose(this);
  return;
}

Assistant:

void TCPSocket::Do() {
	static const int maxLoop = 10;
	auto doClose = false;	
	//this->tid = std::this_thread::get_id();
	auto i = 0;
	for( ;;i++) {
		this->mtx.lock();
		if(!this->closures.empty()) {
			auto front = this->closures.front();
			this->closures.pop_front();
			front();
		}

		auto canRead_ = canRead();
		auto canWrite_ = canWrite();
		if(!(canRead_ || canWrite_) || this->closed) {
			if(!closed) {
				this->doing =false;
			} else {
				doClose = true;
			}
			this->mtx.unlock();
			if(doClose){
				this->doClose();
			}
			//this->tid = std::thread::id();
			return;
		}
		this->mtx.unlock();
		if(i >= maxLoop){
			//执行次数过多了，暂停一下，将cpu让给其它任务执行
			//this->tid = std::thread::id();
			poller_->PostTask(shared_from_this(),this->pool_);
			return;
		} else {


			if(canRead_){
				recvInWorker();
			}

#ifdef USE_SSL
			if(canWrite_){
				sendInWorkerSSL();
			}
#else
			if(canWrite_){
				sendInWorker();
			}
#endif

		}
	}
}